

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O0

RESOURCE_STATE Diligent::VkAccessFlagsToResourceStates(VkAccessFlags AccessFlags)

{
  int iVar1;
  Uint32 BitPos;
  RESOURCE_STATE RVar2;
  RESOURCE_STATE local_20;
  Uint32 lsb;
  Uint32 State;
  Uint32 local_c;
  VkAccessFlags AccessFlags_local;
  
  if (VkAccessFlagsToResourceStates(unsigned_int)::BitPosToState == '\0') {
    iVar1 = __cxa_guard_acquire(&VkAccessFlagsToResourceStates(unsigned_int)::BitPosToState);
    if (iVar1 != 0) {
      VkAccessFlagBitPosToResourceState::VkAccessFlagBitPosToResourceState
                (&VkAccessFlagsToResourceStates::BitPosToState);
      __cxa_guard_release(&VkAccessFlagsToResourceStates(unsigned_int)::BitPosToState);
    }
  }
  local_20 = RESOURCE_STATE_UNKNOWN;
  for (local_c = AccessFlags; local_c != 0;
      local_c = (1 << ((byte)BitPos & 0x1f) ^ 0xffffffffU) & local_c) {
    BitPos = LinuxMisc::GetLSB(local_c);
    RVar2 = VkAccessFlagBitPosToResourceState::operator()
                      (&VkAccessFlagsToResourceStates::BitPosToState,BitPos);
    local_20 = RVar2 | local_20;
  }
  return local_20;
}

Assistant:

RESOURCE_STATE VkAccessFlagsToResourceStates(VkAccessFlags AccessFlags)
{
    static const VkAccessFlagBitPosToResourceState BitPosToState;
    Uint32                                         State = 0;
    while (AccessFlags != 0)
    {
        Uint32 lsb = PlatformMisc::GetLSB(AccessFlags);
        State |= BitPosToState(lsb);
        AccessFlags &= ~(1 << lsb);
    }
    return static_cast<RESOURCE_STATE>(State);
}